

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

int run_test_unref_in_prepare_cb(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_80 [8];
  uv_prepare_t h;
  
  puVar2 = uv_default_loop();
  uv_prepare_init(puVar2,(uv_prepare_t *)local_80);
  uv_prepare_start((uv_prepare_t *)local_80,prepare_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  do_close(local_80);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0xa8,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(unref_in_prepare_cb) {
  uv_prepare_t h;
  uv_prepare_init(uv_default_loop(), &h);
  uv_prepare_start(&h, prepare_cb);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}